

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeries.cpp
# Opt level: O1

void __thiscall OpenMD::InversePowerSeries::initialize(InversePowerSeries *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  bool bVar7;
  AtomType *this_01;
  AtomType *this_02;
  long lVar8;
  _Rb_tree_node_base *p_Var9;
  NonBondedInteractionType *this_03;
  pointer this_04;
  int atid2;
  int atid1;
  vector<int,_std::allocator<int>_> powers;
  vector<double,_std::allocator<double>_> coefficients;
  int local_e0;
  int local_dc;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  pointer local_a8;
  undefined1 local_98 [32];
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_78;
  _Rb_tree_node_base *local_70;
  _Rb_tree_node_base *local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_78 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->InversePowerSeriesTypes;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_78);
  piVar1 = (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->InversePowerSeriesTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  this_00 = &this->InversePowerSeriesTids;
  pvVar2 = (this->MixingMap).
           super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->MixingMap).
           super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_04 = pvVar2;
  if (pvVar3 != pvVar2) {
    do {
      std::
      vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>
      ::~vector(this_04);
      this_04 = this_04 + 1;
    } while (this_04 != pvVar3);
    (this->MixingMap).
    super__Vector_base<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>,_std::allocator<std::vector<OpenMD::InversePowerSeriesInteractionData,_std::allocator<OpenMD::InversePowerSeriesInteractionData>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  }
  local_d8._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,(this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count,(value_type_conflict1 *)local_d8);
  local_b8._M_allocated_capacity = 0;
  local_b8._8_8_ = (pointer)0x0;
  local_a8 = (pointer)0x0;
  p_Var9 = (this->forceField_->nonBondedInteractionTypeCont_).data_._M_t._M_impl.
           super__Rb_tree_header._M_header._M_left;
  local_68 = &(this->forceField_->nonBondedInteractionTypeCont_).data_._M_t._M_impl.
              super__Rb_tree_header._M_header;
  if (p_Var9 == local_68) {
    this_03 = (NonBondedInteractionType *)0x0;
  }
  else {
    this_03 = *(NonBondedInteractionType **)(p_Var9 + 2);
  }
  if (this_03 != (NonBondedInteractionType *)0x0) {
    do {
      bVar7 = NonBondedInteractionType::isInversePowerSeries(this_03);
      if (bVar7) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_98,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(p_Var9 + 1));
        local_d8._16_8_ = local_a8;
        local_d8._8_8_ = local_b8._8_8_;
        local_d8._0_8_ = local_b8._M_allocated_capacity;
        local_b8._M_allocated_capacity = local_98._0_8_;
        local_b8._8_8_ = local_98._8_8_;
        local_a8 = (pointer)local_98._16_8_;
        local_98._0_8_ = (string *)0x0;
        local_98._8_8_ = (pointer)0x0;
        local_98._16_8_ = 0;
        local_70 = p_Var9;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98);
        this_01 = ForceField::getAtomType
                            (this->forceField_,(string *)local_b8._M_allocated_capacity);
        if (this_01 == (AtomType *)0x0) {
          snprintf(painCave.errMsg,2000,
                   "InversePowerSeries::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n"
                   ,*(undefined8 *)local_b8._M_allocated_capacity,
                   *(undefined8 *)local_b8._M_allocated_capacity,
                   (((string *)(local_b8._M_allocated_capacity + 0x20))->_M_dataplus)._M_p);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        this_02 = ForceField::getAtomType
                            (this->forceField_,(string *)(local_b8._M_allocated_capacity + 0x20));
        if (this_02 == (AtomType *)0x0) {
          pcVar4 = (((string *)(local_b8._M_allocated_capacity + 0x20))->_M_dataplus)._M_p;
          snprintf(painCave.errMsg,2000,
                   "InversePowerSeries::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                   ,pcVar4,*(undefined8 *)local_b8._M_allocated_capacity,pcVar4);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        local_dc = AtomType::getIdent(this_01);
        if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[local_dc] == -1) {
          sVar5 = (this->InversePowerSeriesTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(local_78,&local_dc);
          (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_dc] = (int)sVar5;
        }
        local_e0 = AtomType::getIdent(this_02);
        if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start[local_e0] == -1) {
          sVar5 = (this->InversePowerSeriesTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(local_78,&local_e0);
          (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_e0] = (int)sVar5;
        }
        lVar8 = __dynamic_cast(this_03,&NonBondedInteractionType::typeinfo,
                               &InversePowerSeriesInteractionType::typeinfo,0);
        if (lVar8 == 0) {
          AtomType::getName_abi_cxx11_((string *)local_d8,this_01);
          uVar6 = local_d8._0_8_;
          AtomType::getName_abi_cxx11_((string *)local_98,this_02);
          snprintf(painCave.errMsg,2000,
                   "InversePowerSeries::initialize could not convert NonBondedInteractionType\n\tto InversePowerSeriesInteractionType for %s - %s interaction.\n"
                   ,uVar6,local_98._0_8_);
          if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
          if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_d8,
                   (vector<int,_std::allocator<int>_> *)(lVar8 + 0x60));
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_98,
                   (vector<double,_std::allocator<double>_> *)(lVar8 + 0x78));
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_48,(vector<int,_std::allocator<int>_> *)local_d8);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_60,(vector<double,_std::allocator<double>_> *)local_98);
        addExplicitInteraction(this,this_01,this_02,&local_48,&local_60);
        if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        p_Var9 = local_70;
        if ((string *)local_98._0_8_ != (string *)0x0) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ - local_98._0_8_);
        }
        if ((string *)local_d8._0_8_ != (string *)0x0) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
        }
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      if (p_Var9 == local_68) {
        this_03 = (NonBondedInteractionType *)0x0;
      }
      else {
        this_03 = *(NonBondedInteractionType **)(p_Var9 + 2);
      }
    } while (this_03 != (NonBondedInteractionType *)0x0);
  }
  this->initialized_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b8);
  return;
}

Assistant:

void InversePowerSeries::initialize() {
    InversePowerSeriesTypes.clear();
    InversePowerSeriesTids.clear();
    MixingMap.clear();
    InversePowerSeriesTids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;
    int ipstid1, ipstid2;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isInversePowerSeries()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "InversePowerSeries::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "InversePowerSeries::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        int atid1 = at1->getIdent();
        if (InversePowerSeriesTids[atid1] == -1) {
          ipstid1 = InversePowerSeriesTypes.size();
          InversePowerSeriesTypes.insert(atid1);
          InversePowerSeriesTids[atid1] = ipstid1;
        }
        int atid2 = at2->getIdent();
        if (InversePowerSeriesTids[atid2] == -1) {
          ipstid2 = InversePowerSeriesTypes.size();
          InversePowerSeriesTypes.insert(atid2);
          InversePowerSeriesTids[atid2] = ipstid2;
        }

        InversePowerSeriesInteractionType* ipsit =
            dynamic_cast<InversePowerSeriesInteractionType*>(nbt);
        if (ipsit == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "InversePowerSeries::initialize could not convert "
                   "NonBondedInteractionType\n"
                   "\tto InversePowerSeriesInteractionType for %s - %s "
                   "interaction.\n",
                   at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        std::vector<int> powers            = ipsit->getPowers();
        std::vector<RealType> coefficients = ipsit->getCoefficients();

        addExplicitInteraction(at1, at2, powers, coefficients);
      }
    }
    initialized_ = true;
  }